

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_from_hex_pl(ptrlen hex)

{
  size_t nw;
  mp_int *pmVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t nibble_within_word;
  size_t word_idx;
  BignumInt digitval;
  BignumInt umask;
  BignumInt lmask;
  BignumInt digit;
  size_t nibble;
  mp_int *x;
  size_t words;
  size_t bits;
  ptrlen hex_local;
  
  uVar4 = hex.len;
  if (uVar4 < 0x4000000000000000) {
    nw = size_t_max(uVar4 * 4 + 0x3f >> 6,1);
    pmVar1 = mp_make_sized(nw);
    for (digit = 0; digit < uVar4; digit = digit + 1) {
      lVar2 = (long)*(char *)((long)hex.ptr + ((uVar4 - 1) - digit));
      uVar3 = (lVar2 - 0x30U ^ lVar2 - 0x57U) &
              ((long)(lVar2 - 0x61U | 0x66U - lVar2) >> 0x3f ^ 0xffffffffffffffffU) ^ lVar2 - 0x30U;
      pmVar1->w[digit >> 4] =
           (((uVar3 ^ lVar2 - 0x37U) &
             ((long)(lVar2 - 0x41U | 0x46U - lVar2) >> 0x3f ^ 0xffffffffffffffffU) ^ uVar3) & 0xf)
           << (sbyte)((digit & 0xf) << 2) | pmVar1->w[digit >> 4];
    }
    return pmVar1;
  }
  __assert_fail("hex.len <= (~(size_t)0) / 4",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x106,"mp_int *mp_from_hex_pl(ptrlen)");
}

Assistant:

mp_int *mp_from_hex_pl(ptrlen hex)
{
    assert(hex.len <= (~(size_t)0) / 4);
    size_t bits = hex.len * 4;
    size_t words = (bits + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
    words = size_t_max(words, 1);
    mp_int *x = mp_make_sized(words);
    for (size_t nibble = 0; nibble < hex.len; nibble++) {
        BignumInt digit = ((const char *)hex.ptr)[hex.len-1 - nibble];

        BignumInt lmask = ~-((BignumInt)((digit-'a')|('f'-digit))
                             >> (BIGNUM_INT_BITS-1));
        BignumInt umask = ~-((BignumInt)((digit-'A')|('F'-digit))
                             >> (BIGNUM_INT_BITS-1));

        BignumInt digitval = digit - '0';
        digitval ^= (digitval ^ (digit - 'a' + 10)) & lmask;
        digitval ^= (digitval ^ (digit - 'A' + 10)) & umask;
        digitval &= 0xF; /* at least be _slightly_ nice about weird input */

        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        x->w[word_idx] |= digitval << (nibble_within_word * 4);
    }
    return x;
}